

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<bool> __thiscall
kj::anon_unknown_31::HttpInputStreamImpl::awaitNextMessage(HttpInputStreamImpl *this)

{
  EventLoop *pEVar1;
  TransformPromiseNodeBase *pTVar2;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  PromiseNode *pPVar3;
  HttpInputStreamImpl *in_RSI;
  Promise<bool> PVar4;
  Own<kj::_::PromiseNode> intermediate;
  ForkedPromise<void> fork;
  undefined1 local_50 [24];
  EventLoop *local_38;
  Own<kj::_::PromiseNode> local_30;
  
  if ((in_RSI->onMessageDone).ptr.ptr == (PromiseFulfiller<void> *)0x0) {
    snarfBufferedLineBreak(in_RSI);
    if ((in_RSI->lineBreakBeforeNextHeader == false) && ((in_RSI->leftover).size_ != 0)) {
      Promise<bool>::Promise((Promise<bool> *)this,true);
      pPVar3 = extraout_RDX_00;
    }
    else {
      (*in_RSI->inner->_vptr_AsyncInputStream[1])
                (&fork,in_RSI->inner,(in_RSI->headerBuffer).ptr,1,(in_RSI->headerBuffer).size_);
      pTVar2 = (TransformPromiseNodeBase *)operator_new(0x30);
      _::TransformPromiseNodeBase::TransformPromiseNodeBase
                (pTVar2,(Own<kj::_::PromiseNode> *)&fork,
                 _::
                 TransformPromiseNode<kj::Promise<bool>,_unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1093:15),_kj::_::PropagateException>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00427b80;
      pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_RSI;
      intermediate.disposer =
           (Disposer *)
           &_::
            HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<bool>,unsigned_long,kj::(anonymous_namespace)::HttpInputStreamImpl::awaitNextMessage()::{lambda(unsigned_long)#1},kj::_::PropagateException>>
            ::instance;
      intermediate.ptr = (PromiseNode *)pTVar2;
      _::maybeChain<bool>((Own<kj::_::PromiseNode> *)(local_50 + 0x10),
                          (Promise<bool> *)&intermediate);
      pEVar1 = local_38;
      local_30.disposer = (Disposer *)local_50._16_8_;
      local_38 = (EventLoop *)0x0;
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_50 + 0x10));
      (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)local_50._16_8_;
      this->inner = (AsyncInputStream *)pEVar1;
      local_30.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode>::dispose(&local_30);
      Own<kj::_::PromiseNode>::dispose(&intermediate);
      Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&fork);
      pPVar3 = extraout_RDX_01;
    }
  }
  else {
    Promise<void>::fork((Promise<void> *)&fork);
    _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)&intermediate);
    Own<kj::_::PromiseNode>::operator=
              ((Own<kj::_::PromiseNode> *)&in_RSI->messageReadQueue,&intermediate);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    _::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_50);
    pTVar2 = (TransformPromiseNodeBase *)operator_new(0x30);
    _::TransformPromiseNodeBase::TransformPromiseNodeBase
              (pTVar2,(Own<kj::_::PromiseNode> *)local_50,
               _::
               TransformPromiseNode<kj::Promise<bool>,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:1081:36),_kj::_::PropagateException>
               ::anon_class_8_1_8991fb9c_for_func::operator());
    (pTVar2->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00427af8;
    pTVar2[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)in_RSI;
    intermediate.disposer =
         (Disposer *)
         &_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<bool>,kj::_::Void,kj::(anonymous_namespace)::HttpInputStreamImpl::awaitNextMessage()::{lambda()#1},kj::_::PropagateException>>
          ::instance;
    intermediate.ptr = (PromiseNode *)pTVar2;
    _::maybeChain<bool>((Own<kj::_::PromiseNode> *)(local_50 + 0x10),(Promise<bool> *)&intermediate)
    ;
    pEVar1 = local_38;
    local_30.disposer = (Disposer *)local_50._16_8_;
    local_38 = (EventLoop *)0x0;
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)(local_50 + 0x10));
    (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)local_50._16_8_;
    this->inner = (AsyncInputStream *)pEVar1;
    local_30.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode>::dispose(&local_30);
    Own<kj::_::PromiseNode>::dispose(&intermediate);
    Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)local_50);
    Own<kj::_::ForkHub<kj::_::Void>_>::dispose(&fork.hub);
    pPVar3 = extraout_RDX;
  }
  PVar4.super_PromiseBase.node.ptr = pPVar3;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<bool>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<bool> awaitNextMessage() override {
    // Waits until more data is available, but doesn't consume it. Returns false on EOF.
    //
    // Used on the server after a request is handled, to check for pipelined requests.
    //
    // Used on the client to detect when idle connections are closed from the server end. (In this
    // case, the promise always returns false or is canceled.)

    if (onMessageDone != nullptr) {
      // We're still working on reading the previous body.
      auto fork = messageReadQueue.fork();
      messageReadQueue = fork.addBranch();
      return fork.addBranch().then([this]() {
        return awaitNextMessage();
      });
    }

    snarfBufferedLineBreak();

    if (!lineBreakBeforeNextHeader && leftover != nullptr) {
      return true;
    }

    return inner.tryRead(headerBuffer.begin(), 1, headerBuffer.size())
        .then([this](size_t amount) -> kj::Promise<bool> {
      if (amount > 0) {
        leftover = headerBuffer.slice(0, amount);
        return awaitNextMessage();
      } else {
        return false;
      }
    });
  }